

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O1

int __thiscall re2::RepetitionWalker::ShortVisit(RepetitionWalker *this,Regexp *re,int parent_arg)

{
  LogMessage LStack_188;
  
  LogMessage::LogMessage
            (&LStack_188,
             "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/re2/re2/parse.cc"
             ,0x231);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)&LStack_188.str_,"RepetitionWalker::ShortVisit called",0x23);
  LogMessage::~LogMessage(&LStack_188);
  return 0;
}

Assistant:

int RepetitionWalker::ShortVisit(Regexp* re, int parent_arg) {
  // This should never be called, since we use Walk and not
  // WalkExponential.
  LOG(DFATAL) << "RepetitionWalker::ShortVisit called";
  return 0;
}